

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O0

void Handlers::Talk_Tell(Character *character,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  mapped_type *this;
  Character *pCVar5;
  long lVar6;
  undefined1 local_170 [8];
  PacketBuilder reply;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  Character *local_98;
  Character *to;
  key_type local_88;
  undefined1 local_58 [8];
  string message;
  string name;
  PacketReader *reader_local;
  Character *character_local;
  
  iVar3 = character->muted_until;
  tVar4 = time((time_t *)0x0);
  if (iVar3 <= tVar4) {
    PacketReader::GetBreakString_abi_cxx11_((string *)((long)&message.field_2 + 8),reader,0xff);
    PacketReader::GetEndString_abi_cxx11_((string *)local_58,reader);
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"ChatLength",(allocator<char> *)((long)&to + 7));
    this = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(pWVar1->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_88);
    iVar3 = util::variant::operator_cast_to_int(this);
    limit_message((string *)local_58,(long)iVar3);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&to + 7));
    pWVar1 = character->world;
    std::__cxx11::string::string((string *)&local_b8,(string *)(message.field_2._M_local_buf + 8));
    pCVar5 = World::GetCharacter(pWVar1,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    local_98 = pCVar5;
    if ((pCVar5 == (Character *)0x0) ||
       (bVar2 = Character::IsHideOnline(pCVar5), pCVar5 = local_98, bVar2)) {
      lVar6 = std::__cxx11::string::length();
      PacketBuilder::PacketBuilder((PacketBuilder *)local_170,PACKET_TALK,PACKET_REPLY,lVar6 + 2);
      PacketBuilder::AddShort((PacketBuilder *)local_170,1);
      PacketBuilder::AddString((PacketBuilder *)local_170,(string *)((long)&message.field_2 + 8));
      Character::Send(character,(PacketBuilder *)local_170);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_170);
    }
    else if ((local_98->whispers & 1U) == 0) {
      pWVar1 = character->world;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"whisper_blocked",&local_119);
      (*(local_98->super_Command_Source)._vptr_Command_Source[2])(&reply.add_size);
      I18N::Format<std::__cxx11::string>
                (&local_f8,&pWVar1->i18n,&local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &reply.add_size);
      Character::Msg(character,pCVar5,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&reply.add_size);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      std::__cxx11::string::string((string *)&local_d8,(string *)local_58);
      Character::Msg(pCVar5,character,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void Talk_Tell(Character *character, PacketReader &reader)
{
	if (character->muted_until > time(0)) return;

	std::string name = reader.GetBreakString();
	std::string message = reader.GetEndString();
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));
	Character *to = character->world->GetCharacter(name);

	if (to && !to->IsHideOnline())
	{
		if (to->whispers)
		{
			to->Msg(character, message);
		}
		else
		{
			character->Msg(to, character->world->i18n.Format("whisper_blocked", to->SourceName()));
		}
	}
	else
	{
		PacketBuilder reply(PACKET_TALK, PACKET_REPLY, 2 + name.length());
		reply.AddShort(TALK_NOTFOUND);
		reply.AddString(name);
		character->Send(reply);
	}
}